

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::return_stmt(analysis *this)

{
  TYPE TVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar2;
  NodePtr tmp_ptr;
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  local_68._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  std::make_shared<dh::TreeNode,char_const(&)[7],int>((char (*) [7])this,(int *)"return");
  std::__cxx11::string::string((string *)&local_38,"return",(allocator *)local_68);
  match(in_RSI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_68._0_4_ = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_68);
  local_68._0_4_ = 6;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_68);
  TVar1 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar1 != SEPOP) {
    assignment_expr((analysis *)local_68);
    TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  }
  std::__cxx11::string::string((string *)(local_68 + 0x10),";",(allocator *)local_68);
  match(in_RSI,(string *)(local_68 + 0x10));
  std::__cxx11::string::~string((string *)(local_68 + 0x10));
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::return_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in return_stmt\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("return",tmp->getLineno());
	match("return");
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::RetK);

	if ( tmp->getType() != TYPE::SEPOP)
	{
		NodePtr tmp_ptr = expr();
		ret->appendChild(tmp_ptr);
	}
	match(";");

	return ret;
}